

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O3

size_t duckdb_brotli::BrotliEncoderEstimatePeakMemoryUsage(int quality,int lgwin,size_t input_size)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  byte bStack_56c;
  undefined8 local_570;
  byte local_568;
  SharedEncoderDictionary local_548;
  
  BrotliInitSharedEncoderDictionary(&local_548);
  iVar13 = 0;
  if (0 < quality) {
    iVar13 = quality;
  }
  iVar11 = 0xb;
  if (iVar13 < 0xb) {
    iVar11 = iVar13;
  }
  uVar3 = 0x1e;
  if (lgwin < 0x19) {
    uVar3 = 0x18;
  }
  if (quality < 3) {
    uVar3 = 0x18;
  }
  if ((uint)lgwin <= uVar3) {
    uVar3 = lgwin;
  }
  uVar12 = 10;
  if (9 < lgwin) {
    uVar12 = uVar3;
  }
  uVar3 = uVar12;
  if ((quality < 2) || (uVar3 = 0xe, (uint)quality < 4)) {
LAB_002f87aa:
    if (quality == 4) {
      if (0xfffff < input_size) {
        iVar11 = 0x36;
      }
LAB_002f87cf:
      bVar1 = false;
      goto LAB_002f87d1;
    }
    if (quality < 5) goto LAB_002f87cf;
    if (0x10 < uVar12) {
      local_568 = (char)iVar11 - 1;
      if ((input_size < 0x100000) || (uVar12 < 0x13)) {
        bStack_56c = 0xf - ((uint)quality < 7);
        iVar11 = 5;
      }
      else {
        bStack_56c = 0xf;
        iVar11 = 6;
      }
      goto LAB_002f87cf;
    }
    iVar11 = 0x28;
    if (6 < (uint)quality) {
      iVar11 = 0x2a - (uint)((uint)quality < 9);
    }
    bVar1 = false;
  }
  else {
    uVar3 = 0x10;
    if ((uint)quality < 9) goto LAB_002f87aa;
    uVar3 = 0x10;
    if ((0x10 < uVar12) && (uVar3 = 0x12, uVar12 < 0x12)) {
      uVar3 = uVar12;
    }
    if ((uint)quality < 10) goto LAB_002f87aa;
    bVar1 = true;
    iVar11 = 10;
LAB_002f87d1:
    if (0x18 < uVar12) {
      if (iVar11 == 3) {
        iVar11 = 0x23;
      }
      else if (iVar11 == 6) {
        iVar11 = 0x41;
      }
      else if (iVar11 == 0x36) {
        iVar11 = 0x37;
      }
    }
    if (quality < 2) {
      uVar7 = 1L << ((byte)uVar12 & 0x3f);
      if (input_size < uVar7) {
        uVar7 = input_size;
      }
      uVar2 = 0x8000;
      if (quality == 1) {
        uVar2 = 0x20000;
      }
      if (uVar7 <= uVar2) {
        uVar2 = uVar7;
      }
      uVar14 = 0x100;
      do {
        uVar4 = uVar14;
        uVar14 = uVar4 * 2;
      } while (uVar4 < uVar2);
      lVar8 = 0;
      lVar5 = uVar4 * 4;
      if (uVar4 < 0x400) {
        lVar5 = lVar8;
      }
      lVar9 = 0x3b10;
      if (quality == 1) {
        uVar2 = 0x20000;
        if (uVar7 < 0x20000) {
          uVar2 = uVar7;
        }
        lVar8 = uVar2 * 5;
        lVar9 = 0x3908;
      }
      return lVar5 + lVar9 + lVar8;
    }
  }
  uVar7 = 1L << ((byte)uVar3 & 0x3f);
  if (uVar3 < uVar12) {
    uVar3 = uVar12;
  }
  sVar10 = (uint)(2 << ((byte)uVar3 & 0x1f)) + uVar7;
  if (input_size < uVar7) {
    sVar10 = input_size;
  }
  uVar6 = 0x17;
  if (uVar3 < 0x17) {
    uVar6 = uVar3;
  }
  uVar2 = 1L << ((char)uVar6 + 1U & 0x3f);
  if (input_size < uVar2) {
    uVar2 = input_size;
  }
  if (input_size < uVar7) {
    uVar7 = input_size;
  }
  lVar8 = 0;
  if (0x22 < iVar11) {
    if (iVar11 < 0x36) {
      lVar9 = 0;
      lVar5 = 0;
      switch(iVar11) {
      case 0x23:
        lVar8 = 0x40000;
LAB_002f8b0c:
        lVar5 = 0x4000000;
        lVar9 = 0;
        break;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        break;
      case 0x28:
      case 0x29:
        lVar8 = 0x40000;
        lVar5 = 0;
        lVar9 = 0x40000;
        break;
      case 0x2a:
        lVar9 = 0x100000;
        lVar8 = 0x40000;
        goto LAB_002f8a84;
      default:
        goto switchD_002f8961_default;
      }
      goto switchD_002f8961_caseD_24;
    }
    if (iVar11 != 0x36) {
      if (iVar11 != 0x37) {
        lVar9 = 0;
        lVar5 = 0;
        if (iVar11 == 0x41) {
          lVar8 = 2L << (bStack_56c & 0x3f);
          lVar9 = (4L << (bStack_56c & 0x3f)) << (local_568 & 0x3f);
          lVar5 = 0x4000000;
        }
        goto switchD_002f8961_caseD_24;
      }
      lVar8 = 0x400000;
      goto LAB_002f8b0c;
    }
    lVar8 = 0x400000;
    goto switchD_002f8961_default;
  }
  lVar9 = 0;
  lVar5 = 0;
  switch(iVar11) {
  case 2:
  case 3:
    lVar8 = 0x40000;
    break;
  case 4:
    lVar8 = 0x80000;
    break;
  case 5:
  case 6:
    lVar8 = 2L << (bStack_56c & 0x3f);
    lVar9 = (4L << (bStack_56c & 0x3f)) << (local_568 & 0x3f);
    goto LAB_002f8a84;
  case 7:
  case 8:
  case 9:
    goto switchD_002f8961_caseD_24;
  case 10:
    uVar14 = 1L << ((byte)uVar12 & 0x3f);
    if (input_size <= uVar14) {
      uVar14 = input_size;
    }
    lVar9 = uVar14 << 3;
    lVar8 = 0x80000;
    goto LAB_002f8a84;
  }
switchD_002f8961_default:
  lVar9 = 0;
LAB_002f8a84:
  lVar5 = 0;
switchD_002f8961_caseD_24:
  uVar14 = uVar7 * 6 + uVar2 * 2;
  if (((uint)quality < 4) && (uVar7 = uVar7 * 0xc + 0x2fff0, uVar7 <= uVar14)) {
    uVar14 = uVar7;
  }
  uVar7 = 0xc800000;
  if (!bVar1) {
    if ((uint)quality < 4) {
      uVar7 = 0;
    }
    else {
      uVar12 = (uint)((uVar2 & 0xffffffff) / 0x1800);
      uVar3 = 0x100;
      if (uVar12 < 0x100) {
        uVar3 = uVar12;
      }
      uVar7 = (ulong)(uVar3 * 0x17b0);
    }
  }
  return uVar7 + lVar8 + lVar9 + lVar5 + uVar14 + sVar10 + uVar2 * 2 + 0x1f7;
}

Assistant:

size_t  duckdb_brotli::BrotliEncoderEstimatePeakMemoryUsage(int quality, int lgwin,
                                            size_t input_size) {
  BrotliEncoderParams params;
  size_t memory_manager_slots = BROTLI_ENCODER_MEMORY_MANAGER_SLOTS;
  size_t memory_manager_size = memory_manager_slots * sizeof(void*);
  BrotliEncoderInitParams(&params);
  params.quality = quality;
  params.lgwin = lgwin;
  params.size_hint = input_size;
  params.large_window = lgwin > BROTLI_MAX_WINDOW_BITS;
  SanitizeParams(&params);
  params.lgblock = ComputeLgBlock(&params);
  ChooseHasher(&params, &params.hasher);
  if (params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    size_t state_size = sizeof(BrotliEncoderState);
    size_t block_size = BROTLI_MIN(size_t, input_size, (1ul << params.lgwin));
    size_t hash_table_size =
        HashTableSize(MaxHashTableSize(params.quality), block_size);
    size_t hash_size =
        (hash_table_size < (1u << 10)) ? 0 : sizeof(int) * hash_table_size;
    size_t cmdbuf_size = params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY ?
        5 * BROTLI_MIN(size_t, block_size, 1ul << 17) : 0;
    if (params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      state_size += sizeof(BrotliOnePassArena);
    } else {
      state_size += sizeof(BrotliTwoPassArena);
    }
    return hash_size + cmdbuf_size + state_size;
  } else {
    size_t short_ringbuffer_size = (size_t)1 << params.lgblock;
    int ringbuffer_bits = ComputeRbBits(&params);
    size_t ringbuffer_size = input_size < short_ringbuffer_size ?
        input_size : (1u << ringbuffer_bits) + short_ringbuffer_size;
    size_t hash_size[4] = {0};
    size_t metablock_size =
        BROTLI_MIN(size_t, input_size, MaxMetablockSize(&params));
    size_t inputblock_size =
        BROTLI_MIN(size_t, input_size, (size_t)1 << params.lgblock);
    size_t cmdbuf_size = metablock_size * 2 + inputblock_size * 6;
    size_t outbuf_size = metablock_size * 2 + 503;
    size_t histogram_size = 0;
    HasherSize(&params, BROTLI_TRUE, input_size, hash_size);
    if (params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT) {
      cmdbuf_size = BROTLI_MIN(size_t, cmdbuf_size,
          MAX_NUM_DELAYED_SYMBOLS * sizeof(Command) + inputblock_size * 12);
    }
    if (params.quality >= MIN_QUALITY_FOR_HQ_BLOCK_SPLITTING) {
      /* Only a very rough estimation, based on enwik8. */
      histogram_size = 200 << 20;
    } else if (params.quality >= MIN_QUALITY_FOR_BLOCK_SPLIT) {
      size_t literal_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      size_t command_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      size_t distance_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      histogram_size = literal_histograms * sizeof(HistogramLiteral) +
                       command_histograms * sizeof(HistogramCommand) +
                       distance_histograms * sizeof(HistogramDistance);
    }
    return (memory_manager_size + ringbuffer_size +
            hash_size[0] + hash_size[1] + hash_size[2] + hash_size[3] +
            cmdbuf_size +
            outbuf_size +
            histogram_size);
  }
}